

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O3

t_pvalue __thiscall
xemmai::t_derived_primitive<double>::f_do_construct
          (t_derived_primitive<double> *this,t_pvalue *a_stack,size_t a_n)

{
  t_heap<xemmai::t_object> *this_00;
  ulong uVar1;
  long lVar2;
  t_queue<128UL> *this_01;
  t_queue<256UL> *this_02;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  t_object *p;
  t_object *ptVar5;
  t_object *ptVar6;
  long lVar7;
  char *pcVar8;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar9;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_00;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_01;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_02;
  size_t a_size;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  t_pvalue tVar13;
  
  uVar1 = *(ulong *)(a_n + 0x20);
  if (uVar1 == 3) {
    aVar9.v_integer = a_n + 0x28;
    dVar12 = (double)(long)*aVar9.v_float;
  }
  else if (uVar1 == 4) {
    aVar9.v_integer = a_n + 0x28;
    dVar12 = *aVar9.v_float;
  }
  else {
    if (((uVar1 < 3) || (*(long *)(*(long *)(uVar1 + 0x40) + 8) == 0)) ||
       (aVar9.v_float = (double)&v__type_id<double>,
       *(undefined8 **)(*(long *)(*(long *)(uVar1 + 0x40) + 0x10) + 8) != &v__type_id<double>)) {
      f_throw_type_error<double>(L"argument0");
    }
    dVar12 = *(double *)(uVar1 + 0x48);
  }
  this_00 = (t_heap<xemmai::t_object> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x30);
  a_size = a_stack[3].field_0.v_integer * 0x10 + 0x50;
  if (a_size < 0x81) {
    ptVar6 = *(t_object **)(in_FS_OFFSET + -0x58);
    if (ptVar6 == (t_object *)0x0) {
      ptVar6 = t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
                         ((t_of<0UL,_65536UL> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x90),this_00);
      ptVar5 = ptVar6->v_next;
      aVar9 = extraout_RDX_02;
    }
    else {
      ptVar5 = ptVar6->v_next;
    }
    *(t_object **)(in_FS_OFFSET + -0x58) = ptVar5;
  }
  else {
    ptVar6 = t_heap<xemmai::t_object>::f_allocate_medium(this_00,a_size);
    aVar9 = extraout_RDX;
  }
  ptVar6->v_next = (t_object *)0x0;
  auVar4 = _DAT_0017f0d0;
  auVar3 = _DAT_0017f0c0;
  lVar2 = a_stack[3].field_0.v_integer;
  if (lVar2 != 0) {
    lVar7 = lVar2 + -1;
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    pcVar8 = ptVar6->v_data + 0x18;
    aVar9.v_integer = 0;
    auVar10 = auVar10 ^ _DAT_0017f0d0;
    do {
      auVar11._8_4_ = (int)aVar9.v_integer;
      auVar11._0_8_ = aVar9.v_integer;
      auVar11._12_4_ = (int)((ulong)aVar9 >> 0x20);
      auVar11 = (auVar11 | auVar3) ^ auVar4;
      if ((bool)(~(auVar11._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar11._0_4_ ||
                  auVar10._4_4_ < auVar11._4_4_) & 1)) {
        pcVar8[-0x10] = '\0';
        pcVar8[-0xf] = '\0';
        pcVar8[-0xe] = '\0';
        pcVar8[-0xd] = '\0';
        pcVar8[-0xc] = '\0';
        pcVar8[-0xb] = '\0';
        pcVar8[-10] = '\0';
        pcVar8[-9] = '\0';
      }
      if ((auVar11._12_4_ != auVar10._12_4_ || auVar11._8_4_ <= auVar10._8_4_) &&
          auVar11._12_4_ <= auVar10._12_4_) {
        pcVar8[0] = '\0';
        pcVar8[1] = '\0';
        pcVar8[2] = '\0';
        pcVar8[3] = '\0';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
      }
      aVar9.v_integer = aVar9.v_integer + 2;
      pcVar8 = pcVar8 + 0x20;
    } while ((double *)(lVar2 + 1U & 0xfffffffffffffffe) != (double *)aVar9.v_integer);
  }
  *(double *)ptVar6->v_data = dVar12;
  this_01 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *this_01->v_head = (t_object *)&a_stack[-5].field_0;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<128UL>::f_next(this_01);
    aVar9 = extraout_RDX_00;
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  ptVar6->v_type = (t_type *)a_stack;
  this_02 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *this_02->v_head = ptVar6;
  if (this_02->v_head == this_02->v_next) {
    t_slot::t_queue<256UL>::f_next(this_02);
    aVar9 = extraout_RDX_01;
  }
  else {
    this_02->v_head = this_02->v_head + 1;
  }
  (this->super_t_derived<xemmai::t_type_of<double>_>).super_t_type_of<double>.
  super_t_derivable<xemmai::t_bears<double,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived_primitive<double>_>
  .super_t_bears<double,_xemmai::t_type_of<xemmai::t_object>_>.
  super_t_derives<double,_xemmai::t_type_of<xemmai::t_object>_>.super_t_type_of<xemmai::t_object>.
  v_this = (t_slot)ptVar6;
  tVar13.field_0.v_integer = aVar9.v_integer;
  tVar13.super_t_pointer.v_p = (t_object *)this;
  return tVar13;
}

Assistant:

t_pvalue f_do_construct(t_pvalue* a_stack, size_t a_n)
	{
		f_check<T>(a_stack[2], L"argument0");
		return this->template f_new<T>(f_as<T>(a_stack[2]));
	}